

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

void test_skipping(char *fmt,...)

{
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_RDX;
  undefined8 in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list ap;
  char buff [1024];
  undefined8 local_4d8;
  void **local_4d0;
  undefined1 *local_4c8;
  undefined1 local_4b8 [8];
  undefined8 local_4b0;
  undefined8 local_4a8;
  undefined8 local_4a0;
  undefined8 local_498;
  undefined8 local_490;
  undefined8 local_488;
  undefined8 local_478;
  undefined8 local_468;
  undefined8 local_458;
  undefined8 local_448;
  undefined8 local_438;
  undefined8 local_428;
  undefined8 local_418;
  char local_408 [1024];
  
  local_4c8 = local_4b8;
  if (in_AL != '\0') {
    local_488 = in_XMM0_Qa;
    local_478 = in_XMM1_Qa;
    local_468 = in_XMM2_Qa;
    local_458 = in_XMM3_Qa;
    local_448 = in_XMM4_Qa;
    local_438 = in_XMM5_Qa;
    local_428 = in_XMM6_Qa;
    local_418 = in_XMM7_Qa;
  }
  local_4d0 = &ap[0].overflow_arg_area;
  local_4d8 = 0x3000000008;
  local_4b0 = in_RSI;
  local_4a8 = in_RDX;
  local_4a0 = in_RCX;
  local_498 = in_R8;
  local_490 = in_R9;
  vsprintf(local_408,fmt,&local_4d8);
  msg = nextmsg;
  nextmsg = (char *)0x0;
  failure_start(skipping_filename,skipping_line,"SKIPPING: %s",local_408);
  failures = failures + L'\xffffffff';
  failed_lines[skipping_line].skip = 1;
  skips = skips + L'\x01';
  return;
}

Assistant:

void
test_skipping(const char *fmt, ...)
{
	char buff[1024];
	va_list ap;

	va_start(ap, fmt);
	vsprintf(buff, fmt, ap);
	va_end(ap);
	/* Use failure() message if set. */
	msg = nextmsg;
	nextmsg = NULL;
	/* failure_start() isn't quite right, but is awfully convenient. */
	failure_start(skipping_filename, skipping_line, "SKIPPING: %s", buff);
	--failures; /* Undo failures++ in failure_start() */
	/* Don't failure_finish() here. */
	/* Mark as skip, so doesn't count as failed test. */
	failed_lines[skipping_line].skip = 1;
	++skips;
}